

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool __thiscall
google::FilenameFlagnameCmp::operator()
          (FilenameFlagnameCmp *this,CommandLineFlagInfo *a,CommandLineFlagInfo *b)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 local_24;
  int cmp;
  CommandLineFlagInfo *b_local;
  CommandLineFlagInfo *a_local;
  FilenameFlagnameCmp *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_24 = strcmp(pcVar1,pcVar2);
  if (local_24 == 0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_24 = strcmp(pcVar1,pcVar2);
  }
  return local_24 < 0;
}

Assistant:

bool operator()(const CommandLineFlagInfo& a,
                  const CommandLineFlagInfo& b) const {
    int cmp = strcmp(a.filename.c_str(), b.filename.c_str());
    if (cmp == 0)
      cmp = strcmp(a.name.c_str(), b.name.c_str());  // secondary sort key
    return cmp < 0;
  }